

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_knum(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  char *p_00;
  lua_Number num;
  char *pcStack_48;
  int32_t k;
  char *p;
  cTValue *o;
  MSize sizekn;
  MSize i;
  GCproto *pt_local;
  BCWriteCtx *ctx_local;
  char *local_10;
  
  uVar2 = pt->sizekn;
  p = (char *)(pt->k).ptr64;
  uVar3 = uVar2 * 10;
  if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).w) < uVar3) {
    local_10 = lj_buf_more2(&ctx->sb,uVar3);
  }
  else {
    local_10 = (ctx->sb).w;
  }
  pcStack_48 = local_10;
  o._4_4_ = 0;
  do {
    if (uVar2 <= o._4_4_) {
      (ctx->sb).w = pcStack_48;
      return;
    }
    if (*(int *)(p + 4) == -0x18001) {
LAB_00119c48:
      p_00 = lj_strfmt_wuleb128(pcStack_48,(*(int *)p << 1 | *(uint *)p & 0x80000000) + 1);
      if (0x7fffffff < *(uint *)p) {
        p_00[-1] = p_00[-1] & 7U | (byte)((uint)*(undefined4 *)p >> 0x1b) & 0x18;
      }
      pcStack_48 = lj_strfmt_wuleb128(p_00,*(uint32_t *)(p + 4));
    }
    else {
      dVar1 = *(double *)p;
      uVar3 = (uint)dVar1;
      if ((dVar1 != (double)(int)uVar3) || (NAN(dVar1) || NAN((double)(int)uVar3)))
      goto LAB_00119c48;
      pcStack_48 = lj_strfmt_wuleb128(pcStack_48,uVar3 << 1 | uVar3 & 0x80000000);
      if ((int)uVar3 < 0) {
        pcStack_48[-1] = pcStack_48[-1] & 7U | (byte)((int)uVar3 >> 0x1b) & 0x18;
      }
    }
    o._4_4_ = o._4_4_ + 1;
    p = p + 8;
  } while( true );
}

Assistant:

static void bcwrite_knum(BCWriteCtx *ctx, GCproto *pt)
{
  MSize i, sizekn = pt->sizekn;
  cTValue *o = mref(pt->k, TValue);
  char *p = lj_buf_more(&ctx->sb, 10*sizekn);
  for (i = 0; i < sizekn; i++, o++) {
    int32_t k;
    if (tvisint(o)) {
      k = intV(o);
      goto save_int;
    } else {
      /* Write a 33 bit ULEB128 for the int (lsb=0) or loword (lsb=1). */
      if (!LJ_DUALNUM && o->u32.hi != LJ_KEYINDEX) {
	/* Narrow number constants to integers. */
	lua_Number num = numV(o);
	k = lj_num2int(num);
	if (num == (lua_Number)k) {  /* -0 is never a constant. */
	save_int:
	  p = lj_strfmt_wuleb128(p, 2*(uint32_t)k | ((uint32_t)k&0x80000000u));
	  if (k < 0)
	    p[-1] = (p[-1] & 7) | ((k>>27) & 0x18);
	  continue;
	}
      }
      p = lj_strfmt_wuleb128(p, 1+(2*o->u32.lo | (o->u32.lo & 0x80000000u)));
      if (o->u32.lo >= 0x80000000u)
	p[-1] = (p[-1] & 7) | ((o->u32.lo>>27) & 0x18);
      p = lj_strfmt_wuleb128(p, o->u32.hi);
    }
  }
  ctx->sb.w = p;
}